

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arraylist.c
# Opt level: O0

int array_list_del_idx(array_list *arr,size_t idx,size_t count)

{
  ulong uVar1;
  size_t stop;
  size_t i;
  size_t count_local;
  size_t idx_local;
  array_list *arr_local;
  
  if (-count - 1 < idx) {
    arr_local._4_4_ = -1;
  }
  else {
    uVar1 = idx + count;
    if ((idx < arr->length) && (stop = idx, uVar1 <= arr->length)) {
      for (; stop < uVar1; stop = stop + 1) {
        if (arr->array[stop] != (void *)0x0) {
          (*arr->free_fn)(arr->array[stop]);
        }
      }
      memmove(arr->array + idx,arr->array + uVar1,(arr->length - uVar1) * 8);
      arr->length = arr->length - count;
      arr_local._4_4_ = 0;
    }
    else {
      arr_local._4_4_ = -1;
    }
  }
  return arr_local._4_4_;
}

Assistant:

int array_list_del_idx(struct array_list *arr, size_t idx, size_t count)
{
	size_t i, stop;

	/* Avoid overflow in calculation with large indices. */
	if (idx > SIZE_T_MAX - count)
		return -1;
	stop = idx + count;
	if (idx >= arr->length || stop > arr->length)
		return -1;
	for (i = idx; i < stop; ++i)
	{
		// Because put_idx can skip entries, we need to check if
		// there's actually anything in each slot we're erasing.
		if (arr->array[i])
			arr->free_fn(arr->array[i]);
	}
	memmove(arr->array + idx, arr->array + stop, (arr->length - stop) * sizeof(void *));
	arr->length -= count;
	return 0;
}